

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_qcc_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  uint_fast16_t val;
  int iVar1;
  int iVar2;
  jas_stream_t *extraout_RDX;
  jas_stream_t *extraout_RDX_00;
  jas_stream_t *out_00;
  
  val = (ms->parms).sot.tileno;
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_putuint8(out,(uint_fast8_t)val);
    out_00 = extraout_RDX;
  }
  else {
    iVar1 = jpc_putuint16(out,val);
    out_00 = extraout_RDX_00;
  }
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = jpc_qcx_putcompparms
                      ((jpc_qcxcp_t *)&(ms->parms).qcd.compparms.stepsizes,(jpc_cstate_t *)out,
                       out_00);
    iVar2 = -(uint)(iVar1 != 0);
  }
  return iVar2;
}

Assistant:

static int jpc_qcc_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	if (cstate->numcomps <= 256) {
		if (jpc_putuint8(out, qcc->compno)) {
			return -1;
		}
	} else {
		if (jpc_putuint16(out, qcc->compno)) {
			return -1;
		}
	}
	if (jpc_qcx_putcompparms(&qcc->compparms, cstate, out)) {
		return -1;
	}
	return 0;
}